

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsat.hpp
# Opt level: O0

void __thiscall subsat::Solver::prepare_for_solving(Solver *this)

{
  bool bVar1;
  Lit lit;
  ConstraintHandle CVar2;
  size_type sVar3;
  reference ppVar4;
  vector_map_t<subsat::Var,_signed_char,_std::allocator<signed_char>,_subsat::IndexMember<subsat::Var>_>
  *in_RDI;
  SubstitutionTheory *in_stack_00000010;
  AllocatedConstraintHandle ca;
  ConstraintRef cr;
  Kind kind;
  pair<subsat::Constraint::Kind,_subsat::ConstraintRef> p;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<Constraint::Kind,_ConstraintRef>_> *__range2;
  undefined4 in_stack_ffffffffffffff98;
  Kind in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  index_type in_stack_ffffffffffffffc0;
  ConstraintRef cr_00;
  ConstraintRef in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  vector<subsat::Lit,_std::allocator<subsat::Lit>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_*,_std::vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>_>
  local_20;
  vector_map_t<subsat::Var,_signed_char,_std::allocator<signed_char>,_subsat::IndexMember<subsat::Var>_>
  *local_18;
  undefined1 local_a;
  undefined1 local_9;
  
  *(undefined4 *)
   ((long)&(((_Vector_base<subsat::VarInfo,_std::allocator<subsat::VarInfo>_> *)
            &(in_RDI->m_data).super__Vector_base<signed_char,_std::allocator<signed_char>_>)->
           _M_impl).super__Vector_impl_data._M_finish + 4) =
       *(undefined4 *)
        &(((_Vector_base<subsat::VarInfo,_std::allocator<subsat::VarInfo>_> *)
          &(in_RDI->m_data).super__Vector_base<signed_char,_std::allocator<signed_char>_>)->_M_impl)
         .super__Vector_impl_data._M_finish;
  vector_map_t<subsat::Var,_subsat::VarInfo,_std::allocator<subsat::VarInfo>,_subsat::IndexMember<subsat::Var>_>
  ::resize((vector_map_t<subsat::Var,_subsat::VarInfo,_std::allocator<subsat::VarInfo>,_subsat::IndexMember<subsat::Var>_>
            *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_9 = 0;
  vector_map_t<subsat::Var,_signed_char,_std::allocator<signed_char>,_subsat::IndexMember<subsat::Var>_>
  ::resize(in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
           (value_type *)0xaafbfa);
  local_a = 0;
  vector_map_t<subsat::Lit,_subsat::Value,_std::allocator<subsat::Value>,_subsat::IndexMember<subsat::Lit>_>
  ::resize((vector_map_t<subsat::Lit,_subsat::Value,_std::allocator<subsat::Value>,_subsat::IndexMember<subsat::Lit>_>
            *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
           (value_type *)0xaafc1e);
  sVar3 = vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
          ::size((vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
                  *)0xaafc2f);
  if (sVar3 < (uint)(*(int *)&(in_RDI->m_data).
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_finish << 1)) {
    vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
    ::resize((vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
              *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  sVar3 = vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
          ::size((vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
                  *)0xaafc6e);
  if (sVar3 < (uint)(*(int *)&(in_RDI->m_data).
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_finish << 1)) {
    vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
    ::resize((vector_map_t<subsat::Lit,_std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>,_subsat::IndexMember<subsat::Lit>_>
              *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  DecisionQueue::resize_and_init
            ((DecisionQueue *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  std::vector<subsat::Lit,_std::allocator<subsat::Lit>_>::reserve
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  local_18 = in_RDI + 9;
  local_20._M_current =
       (pair<subsat::Constraint::Kind,_subsat::ConstraintRef> *)
       std::
       vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
       ::begin((vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::
  vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
  ::end((vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_*,_std::vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_*,_std::vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar1) {
      vector_map_t<unsigned_int,_unsigned_char,_std::allocator<unsigned_char>,_subsat::IndexIdentity<unsigned_int>_>
      ::resize((vector_map_t<unsigned_int,_unsigned_char,_std::allocator<unsigned_char>,_subsat::IndexIdentity<unsigned_int>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (value_type_conflict1 *)0xaafdc1);
      bVar1 = ConstraintRef::is_valid((ConstraintRef *)in_RDI);
      if (!bVar1) {
        alloc_constraint((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (uint32_t)((ulong)in_RDI >> 0x20));
        lit = Lit::invalid();
        handle_push_literal((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (AllocatedConstraintHandle *)in_RDI,lit);
        Lit::invalid();
        handle_push_literal((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (AllocatedConstraintHandle *)in_RDI,lit);
        CVar2 = handle_build((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                             ,(AllocatedConstraintHandle *)in_RDI);
        *(ConstraintRef *)
         &in_RDI[0x13].m_data.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = CVar2.m_ref.m_index;
      }
      SubstitutionTheory::prepare_for_solving(in_stack_00000010);
      theory_propagate_initial
                ((Solver *)CONCAT44(in_stack_ffffffffffffffc4.m_index,in_stack_ffffffffffffffc0));
      return;
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_*,_std::vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>_>
             ::operator*(&local_20);
    in_stack_ffffffffffffff9c = (*ppVar4).first;
    cr_00 = (*ppVar4).second;
    if (in_stack_ffffffffffffff9c == Clause) {
      simplify_and_connect_clause((Solver *)(ulong)cr_00.m_index,cr_00);
      in_stack_ffffffffffffffc4.m_index = cr_00.m_index;
    }
    else if (in_stack_ffffffffffffff9c == AtMostOne) {
      simplify_and_connect_atmostone_constraint
                ((Solver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffc4);
      in_stack_ffffffffffffffc0 = cr_00.m_index;
    }
    if (((ulong)(in_RDI->m_data).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start & 0x100000000) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_*,_std::vector<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void prepare_for_solving()
  {
    ASS_EQ(m_state, State::Unknown);
    ASS_EQ(m_level, 0);

    ASS_EQ(m_values.size(), 0);
    m_unassigned_vars = m_used_vars;
    m_vars.resize(m_used_vars);
    m_marks.resize(m_used_vars, 0);
    m_values.resize(2 * m_used_vars, Value::Unassigned);
    if (m_watches.size() < 2 * m_used_vars) {
      m_watches.resize(2 * m_used_vars);
    }
    if (m_watches_amo.size() < 2 * m_used_vars) {
      m_watches_amo.resize(2 * m_used_vars);
    }

#if SUBSAT_VDOM
    m_vdom.prepare_for_solving();
#endif
#if SUBSAT_VMTF
    m_queue.resize_and_init(m_used_vars);
    ASS(m_queue.checkInvariants(m_values));
#endif

    m_trail.reserve(m_used_vars);

    for (auto p : m_original_constraints) {
      Constraint::Kind const kind = p.first;
      ConstraintRef cr = p.second;
      switch (kind) {
        case Constraint::Kind::Clause:
          simplify_and_connect_clause(cr);
          break;
        case Constraint::Kind::AtMostOne:
          simplify_and_connect_atmostone_constraint(cr);
          break;
      }
      if (m_inconsistent) {
        // If we're inconsistent there's no point in further adding constraints
        return;
      }
    }

    m_frames.resize(m_used_vars + 1, 0);

    if (!tmp_propagate_binary_conflict_ref.is_valid()) {
      auto ca = alloc_constraint(2);
      handle_push_literal(ca, Lit::invalid());
      handle_push_literal(ca, Lit::invalid());
      tmp_propagate_binary_conflict_ref = handle_build(ca).m_ref;
    }

    m_theory.prepare_for_solving();
    theory_propagate_initial();
  }